

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPlaMo.c
# Opt level: O1

void Mop_ManPrint(Mop_Man_t *p)

{
  Vec_Int_t *pVVar1;
  long lVar2;
  
  printf(".%d\n",(ulong)(uint)p->nIns);
  printf(".%d\n",(ulong)(uint)p->nOuts);
  pVVar1 = p->vCubes;
  if (0 < pVVar1->nSize) {
    lVar2 = 0;
    do {
      Mop_ManPrintOne(p,pVVar1->pArray[lVar2]);
      lVar2 = lVar2 + 1;
      pVVar1 = p->vCubes;
    } while (lVar2 < pVVar1->nSize);
  }
  puts(".e");
  return;
}

Assistant:

void Mop_ManPrint( Mop_Man_t * p )
{
    int i, iCube;
    printf( ".%d\n", p->nIns );
    printf( ".%d\n", p->nOuts );
    Vec_IntForEachEntry( p->vCubes, iCube, i )
        Mop_ManPrintOne( p, iCube );
    printf( ".e\n" );
}